

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

MESSAGE_HANDLE message_create(void)

{
  MESSAGE_HANDLE pMVar1;
  LOGGER_LOG p_Var2;
  
  pMVar1 = (MESSAGE_HANDLE)calloc(1,0x60);
  if (pMVar1 == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_create",0x6d,1,"Cannot allocate memory for message");
    }
  }
  else {
    *(undefined8 *)((long)&pMVar1->application_properties + 4) = 0;
    *(undefined8 *)((long)&pMVar1->footer + 4) = 0;
    pMVar1->properties = (PROPERTIES_HANDLE)0x0;
    pMVar1->application_properties = (application_properties)0x0;
    pMVar1->delivery_annotations = (delivery_annotations)0x0;
    pMVar1->message_annotations = (message_annotations)0x0;
    pMVar1->body_amqp_value = (AMQP_VALUE)0x0;
    pMVar1->header = (HEADER_HANDLE)0x0;
    pMVar1->body_amqp_sequence_items = (AMQP_VALUE *)0x0;
    pMVar1->body_amqp_sequence_count = 0;
    pMVar1->body_amqp_data_items = (BODY_AMQP_DATA *)0x0;
    pMVar1->body_amqp_data_count = 0;
  }
  return pMVar1;
}

Assistant:

MESSAGE_HANDLE message_create(void)
{
    MESSAGE_HANDLE result = (MESSAGE_HANDLE)calloc(1, sizeof(MESSAGE_INSTANCE));
    if (result == NULL)
    {
        /* Codes_SRS_MESSAGE_01_002: [If allocating memory for the message fails, `message_create` shall fail and return NULL.] */
        LogError("Cannot allocate memory for message");
    }
    else
    {
        result->header = NULL;
        result->delivery_annotations = NULL;
        result->message_annotations = NULL;
        result->properties = NULL;
        result->application_properties = NULL;
        result->footer = NULL;
        result->body_amqp_data_items = NULL;
        result->body_amqp_data_count = 0;
        result->body_amqp_value = NULL;
        result->body_amqp_sequence_items = NULL;
        result->body_amqp_sequence_count = 0;

        /* Codes_SRS_MESSAGE_01_135: [ By default a message on which `message_set_message_format` was not called shall have message format set to 0. ]*/
        result->message_format = 0;
    }

    /* Codes_SRS_MESSAGE_01_001: [`message_create` shall create a new AMQP message instance and on success it shall return a non-NULL handle for the newly created message instance.] */
    return result;
}